

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceTests.cpp
# Opt level: O0

int testOptionalInputs(void)

{
  bool bVar1;
  Normalizer *this;
  Imputer *this_00;
  ostream *poVar2;
  Result local_2f0;
  allocator<char> local_2c1;
  string local_2c0;
  undefined1 local_2a0 [8];
  Model m4;
  allocator<char> local_241;
  string local_240;
  undefined1 local_220 [8];
  Model m3;
  allocator<char> local_1c1;
  string local_1c0;
  Result local_1a0;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  undefined1 local_128 [8];
  Model m2;
  allocator<char> local_c9;
  string local_c8;
  undefined4 local_a4;
  Result local_a0;
  allocator<char> local_71;
  string local_70;
  undefined1 local_40 [8];
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)local_40);
  this = CoreML::Specification::Model::mutable_normalizer((Model *)local_40);
  CoreML::Specification::Normalizer::set_normtype(this,Normalizer_NormType_L2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"x",&local_71);
  addRequiredField((Model *)local_40,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  CoreML::validateOptional(&local_a0,(Model *)local_40);
  bVar1 = CoreML::Result::good(&local_a0);
  CoreML::Result::~Result(&local_a0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"y",&local_c9);
    addOptionalField((Model *)local_40,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    CoreML::validateOptional((Result *)&m2._cached_size_,(Model *)local_40);
    bVar1 = CoreML::Result::good((Result *)&m2._cached_size_);
    CoreML::Result::~Result((Result *)&m2._cached_size_);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x35);
      poVar2 = std::operator<<(poVar2,": error: ");
      poVar2 = std::operator<<(poVar2,"!((validateOptional(m1)).good())");
      poVar2 = std::operator<<(poVar2," was false, expected true.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      m1._oneof_case_[0] = 1;
      local_a4 = 1;
    }
    else {
      CoreML::Specification::Model::Model((Model *)local_128);
      this_00 = CoreML::Specification::Model::mutable_imputer((Model *)local_128);
      CoreML::Specification::Imputer::set_imputeddoublevalue(this_00,3.14);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"x",&local_149);
      addRequiredField((Model *)local_128,&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      std::allocator<char>::~allocator(&local_149);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"y",&local_171);
      addOptionalField((Model *)local_128,&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::allocator<char>::~allocator(&local_171);
      CoreML::validateOptional(&local_1a0,(Model *)local_128);
      bVar1 = CoreML::Result::good(&local_1a0);
      CoreML::Result::~Result(&local_1a0);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"z",&local_1c1);
        addOptionalField((Model *)local_128,&local_1c0);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::allocator<char>::~allocator(&local_1c1);
        CoreML::validateOptional((Result *)&m3._cached_size_,(Model *)local_128);
        bVar1 = CoreML::Result::good((Result *)&m3._cached_size_);
        CoreML::Result::~Result((Result *)&m3._cached_size_);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          CoreML::Specification::Model::Model((Model *)local_220);
          CoreML::Specification::Model::mutable_treeensembleregressor((Model *)local_220);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"x",&local_241);
          addRequiredField((Model *)local_220,&local_240);
          std::__cxx11::string::~string((string *)&local_240);
          std::allocator<char>::~allocator(&local_241);
          CoreML::validateOptional((Result *)&m4._cached_size_,(Model *)local_220);
          bVar1 = CoreML::Result::good((Result *)&m4._cached_size_);
          CoreML::Result::~Result((Result *)&m4._cached_size_);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            CoreML::Specification::Model::Model((Model *)local_2a0);
            CoreML::Specification::Model::mutable_treeensembleregressor((Model *)local_2a0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"x",&local_2c1);
            addOptionalField((Model *)local_2a0,&local_2c0);
            std::__cxx11::string::~string((string *)&local_2c0);
            std::allocator<char>::~allocator(&local_2c1);
            CoreML::validateOptional(&local_2f0,(Model *)local_2a0);
            bVar1 = CoreML::Result::good(&local_2f0);
            CoreML::Result::~Result(&local_2f0);
            m1._oneof_case_[0]._0_1_ = ((bVar1 ^ 0xffU) & 1) != 0;
            if (m1._oneof_case_[0]._0_1_) {
              poVar2 = std::operator<<((ostream *)&std::cout,
                                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                      );
              poVar2 = std::operator<<(poVar2,":");
              poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x4b);
              poVar2 = std::operator<<(poVar2,": error: ");
              poVar2 = std::operator<<(poVar2,"(validateOptional(m4)).good()");
              poVar2 = std::operator<<(poVar2," was false, expected true.");
              std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            }
            m1._oneof_case_[0]._1_3_ = 0;
            local_a4 = 1;
            CoreML::Specification::Model::~Model((Model *)local_2a0);
          }
          else {
            poVar2 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                    );
            poVar2 = std::operator<<(poVar2,":");
            poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x46);
            poVar2 = std::operator<<(poVar2,": error: ");
            poVar2 = std::operator<<(poVar2,"(validateOptional(m3)).good()");
            poVar2 = std::operator<<(poVar2," was false, expected true.");
            std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            m1._oneof_case_[0] = 1;
            local_a4 = 1;
          }
          CoreML::Specification::Model::~Model((Model *)local_220);
        }
        else {
          poVar2 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                  );
          poVar2 = std::operator<<(poVar2,":");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x40);
          poVar2 = std::operator<<(poVar2,": error: ");
          poVar2 = std::operator<<(poVar2,"(validateOptional(m2)).good()");
          poVar2 = std::operator<<(poVar2," was false, expected true.");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          m1._oneof_case_[0] = 1;
          local_a4 = 1;
        }
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x3d);
        poVar2 = std::operator<<(poVar2,": error: ");
        poVar2 = std::operator<<(poVar2,"(validateOptional(m2)).good()");
        poVar2 = std::operator<<(poVar2," was false, expected true.");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        m1._oneof_case_[0] = 1;
        local_a4 = 1;
      }
      CoreML::Specification::Model::~Model((Model *)local_128);
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x32);
    poVar2 = std::operator<<(poVar2,": error: ");
    poVar2 = std::operator<<(poVar2,"(validateOptional(m1)).good()");
    poVar2 = std::operator<<(poVar2," was false, expected true.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    m1._oneof_case_[0] = 1;
    local_a4 = 1;
  }
  CoreML::Specification::Model::~Model((Model *)local_40);
  return m1._oneof_case_[0];
}

Assistant:

int testOptionalInputs() {
    // Test that all fields are required on a random model (normalizer)
    Specification::Model m1;
    m1.mutable_normalizer()->set_normtype(Specification::Normalizer_NormType::Normalizer_NormType_L2);
    addRequiredField(m1, "x");
    ML_ASSERT_GOOD(validateOptional(m1));

    addOptionalField(m1, "y");
    ML_ASSERT_BAD(validateOptional(m1));

    // Test that at least one optional field is required on an imputer
    // (more than one allowed)
    Specification::Model m2;
    m2.mutable_imputer()->set_imputeddoublevalue(3.14);
    addRequiredField(m2, "x");
    addOptionalField(m2, "y");
    ML_ASSERT_GOOD(validateOptional(m2));

    addOptionalField(m2, "z");
    ML_ASSERT_GOOD(validateOptional(m2));

    // Test that any fields can be optional or required for trees
    Specification::Model m3;
    (void) m3.mutable_treeensembleregressor();
    addRequiredField(m3, "x");
    ML_ASSERT_GOOD(validateOptional(m3));

    Specification::Model m4;
    (void) m4.mutable_treeensembleregressor();
    addOptionalField(m4, "x");
    ML_ASSERT_GOOD(validateOptional(m4));

    return 0;
}